

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

Float __thiscall pbrt::WrinkledTexture::Evaluate(WrinkledTexture *this,TextureEvalContext ctx)

{
  Vector3f dpdy;
  Vector3f dpdx;
  Float FVar1;
  Point3f p;
  Tuple3<pbrt::Vector3,_float> local_38;
  Tuple3<pbrt::Vector3,_float> local_28;
  
  local_28.x = 0.0;
  local_28.y = 0.0;
  local_28.z = 0.0;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 0.0;
  p = TransformMapping3D::Map
                ((TransformMapping3D *)
                 ((this->mapping).super_TaggedPointer<pbrt::TransformMapping3D>.bits &
                 0xffffffffffff),ctx,(Vector3f *)&local_28,(Vector3f *)&local_38);
  dpdx.super_Tuple3<pbrt::Vector3,_float>.z = local_28.z;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.x = local_28.x;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.y = local_28.y;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.z = local_38.z;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.x = local_38.x;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.y = local_38.y;
  FVar1 = Turbulence(p,dpdx,dpdy,this->omega,this->octaves);
  return FVar1;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        Vector3f dpdx, dpdy;
        Point3f p = mapping.Map(ctx, &dpdx, &dpdy);
        return Turbulence(p, dpdx, dpdy, omega, octaves);
    }